

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O2

char * server_extension_to_string(server_extension_type extension)

{
  char *pcVar1;
  
  if (extension < (NO_EXTENSION|XINERAMA)) {
    pcVar1 = (&PTR_anon_var_dwarf_ddaf_00111ce0)[extension];
  }
  else {
    pcVar1 = "";
  }
  return pcVar1;
}

Assistant:

const char *server_extension_to_string(enum server_extension_type extension)
{
        switch (extension) {
        case RANDR:
                return "RANDR";
        case XINERAMA:
                return "Xinerama";
        case NO_EXTENSION:
                return "X";
        default:
                return "";
        }
}